

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkPrintDistrib(Cba_Ntk_t *p,int fVerbose)

{
  Cba_ObjType_t CVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Cba_ObjType_t CVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Wrd_t *pVVar9;
  Vec_Wrd_t *pVVar10;
  word wVar11;
  char *pcVar12;
  int iVar13;
  word wVar14;
  char *pcVar15;
  Vec_Ptr_t *pMap;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  uint local_344;
  char *pTypeNames [90];
  
  p_00 = Vec_IntStart(0x5a);
  pMap = (Vec_Ptr_t *)pTypeNames;
  Cba_ManCreatePrimMap((char **)pMap);
  p_01 = Vec_PtrStart((int)pMap);
  p_02 = Vec_PtrStart((int)pMap);
  for (iVar13 = 0; iVar13 != 0x5a; iVar13 = iVar13 + 1) {
    pVVar9 = Vec_WrdAlloc((int)pMap);
    pMap = p_01;
    Vec_PtrWriteEntry(p_01,iVar13,pVVar9);
  }
  for (iVar13 = 0; iVar13 != 0x5a; iVar13 = iVar13 + 1) {
    pVVar9 = Vec_WrdAlloc((int)pMap);
    pMap = p_02;
    Vec_PtrWriteEntry(p_02,iVar13,pVVar9);
  }
  local_344 = 0xffffffff;
  uVar17 = 1;
  iVar13 = 0;
  do {
    if ((p->vObjType).nSize <= (int)uVar17) {
      if (iVar13 != 0) {
        printf("Warning: %d objects of the design have non-zero-based ranges.\n");
        iVar13 = Cba_ObjFon0(p,local_344);
        pcVar12 = Cba_FonNameStr(p,iVar13);
        uVar17 = Cba_ObjRangeSize(p,local_344);
        uVar2 = Cba_ObjLeft(p,local_344);
        uVar3 = Cba_ObjRight(p,local_344);
        printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",(ulong)local_344,
               pcVar12,(ulong)uVar17,(ulong)uVar2,(ulong)uVar3);
      }
      puts(
          "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ..."
          );
      pcVar12 = "";
      for (uVar18 = 0; uVar18 != 0x5a; uVar18 = uVar18 + 1) {
        iVar13 = (int)uVar18;
        pVVar9 = (Vec_Wrd_t *)Vec_PtrEntry(p_01,iVar13);
        pVVar10 = (Vec_Wrd_t *)Vec_PtrEntry(p_02,iVar13);
        uVar17 = p->pDesign->nObjs[uVar18];
        if (uVar17 != 0) {
          pcVar15 = pTypeNames[uVar18];
          uVar2 = Vec_IntEntry(p_00,iVar13);
          printf("%2d  :  %-8s  %6d%8d ",uVar18 & 0xffffffff,pcVar15,(ulong)uVar17,(ulong)uVar2);
          Cba_NtkPrintDistribSortOne(p_01,p_02,iVar13);
          for (uVar17 = 0; (int)uVar17 < pVVar9->nSize; uVar17 = uVar17 + 1) {
            wVar14 = Vec_WrdEntry(pVVar9,uVar17);
            if ((((uVar17 / 6) * 6 + 5 == uVar17) && (0x3ffffffffff < wVar14)) ||
               (((~uVar17 & 7) == 0 && (wVar14 < 0x40000000000)))) {
              printf("\n                                ");
            }
            uVar2 = (uint)(wVar14 >> 0x15) & 0x1fffff;
            uVar3 = (uint)wVar14 & 0x1fffff;
            wVar11 = Vec_WrdEntry(pVVar10,uVar17);
            printf("(%d)",wVar11 & 0xffffffff);
            iVar13 = Abc_LitIsCompl(uVar3);
            pcVar15 = "-";
            if (iVar13 == 0) {
              pcVar15 = pcVar12;
            }
            uVar3 = Abc_Lit2Var(uVar3);
            printf("%s%d",pcVar15,(ulong)uVar3);
            if ((wVar14 >> 0x15 & 0x1fffff) != 0) {
              iVar13 = Abc_LitIsCompl(uVar2);
              pcVar15 = "-";
              if (iVar13 == 0) {
                pcVar15 = pcVar12;
              }
              uVar2 = Abc_Lit2Var(uVar2);
              printf("=%s%d",pcVar15,(ulong)uVar2);
            }
            if (0x3ffffffffff < wVar14) {
              uVar2 = (uint)(wVar14 >> 0x20);
              iVar13 = Abc_LitIsCompl(uVar2 >> 10);
              pcVar15 = "-";
              if (iVar13 == 0) {
                pcVar15 = pcVar12;
              }
              uVar2 = Abc_Lit2Var(uVar2 >> 10);
              printf(".%s%d",pcVar15,(ulong)uVar2);
            }
            putchar(0x20);
          }
          putchar(10);
        }
      }
      Vec_VecFree((Vec_Vec_t *)p_01);
      Vec_VecFree((Vec_Vec_t *)p_02);
      Vec_IntFree(p_00);
      return;
    }
    CVar1 = Cba_ObjType(p,uVar17);
    if (CVar1 == CBA_OBJ_NONE) goto switchD_003508b6_caseD_b;
    CVar1 = Cba_ObjType(p,uVar17);
    uVar2 = Cba_ObjSign(p,uVar17);
    if (0x1fffff < uVar2) {
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      uVar3 = Cba_ObjRangeSize(p,uVar17);
      printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",(ulong)uVar17,
             (ulong)uVar2,(ulong)(uVar3 & 0xfffff));
    }
    iVar4 = Cba_ObjLeft(p,uVar17);
    if ((iVar4 != 0) && (iVar4 = Cba_ObjRight(p,uVar17), iVar4 != 0)) {
      if (local_344 == 0xffffffff) {
        local_344 = 1;
      }
      iVar13 = iVar13 + 1;
    }
    iVar4 = Cba_ObjIsPi(p,uVar17);
    if (iVar4 == 0) {
      CVar5 = CVar1 & 0xff;
      if ((byte)CVar1 < 0x3a) {
        if ((0x380000200000200U >> ((ulong)CVar5 & 0x3f) & 1) == 0) {
          if ((ulong)CVar5 != 8) goto LAB_003508df;
          iVar4 = Cba_ObjFinFon(p,uVar17,0);
          if (iVar4 < 0) goto LAB_003507cf;
        }
LAB_003507fe:
        uVar2 = Cba_ObjSign(p,uVar17);
        iVar4 = Cba_ObjFinFon(p,uVar17,0);
        uVar3 = Cba_ObjSign(p,iVar4);
        wVar14 = (ulong)uVar2 | (ulong)uVar3 << 0x15;
      }
      else {
LAB_003508df:
        if (CVar5 == CBA_BOX_CONCAT) goto LAB_003507cf;
        if ((0xfffffff9 < CVar1 - CBA_BOX_LNOT) || (iVar4 = Cba_ObjFinNum(p,uVar17), iVar4 == 1))
        goto LAB_003507fe;
        iVar4 = Cba_ObjFinNum(p,uVar17);
        if (iVar4 < 2) {
          __assert_fail("Cba_ObjFinNum(p, i) >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaNtk.c"
                        ,0x82,"void Cba_NtkPrintDistrib(Cba_Ntk_t *, int)");
        }
        uVar2 = Cba_ObjSign(p,uVar17);
        iVar4 = Cba_ObjFinFon(p,uVar17,0);
        uVar3 = Cba_ObjSign(p,iVar4);
        iVar4 = Cba_ObjFinFon(p,uVar17,1);
        uVar6 = Cba_ObjSign(p,iVar4);
        wVar14 = (ulong)uVar2 | (ulong)uVar6 << 0x2a | (ulong)uVar3 << 0x15;
      }
    }
    else {
LAB_003507cf:
      uVar2 = Cba_ObjSign(p,uVar17);
      wVar14 = (word)uVar2;
    }
    pVVar9 = (Vec_Wrd_t *)Vec_PtrEntry(p_01,CVar1);
    pVVar10 = (Vec_Wrd_t *)Vec_PtrEntry(p_02,CVar1);
    for (lVar16 = 0; iVar4 = (int)lVar16, iVar4 < pVVar9->nSize; lVar16 = lVar16 + 1) {
      wVar11 = Vec_WrdEntry(pVVar9,iVar4);
      if (wVar11 == wVar14) {
        if (pVVar10->nSize <= iVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1e0,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
        }
        pVVar10->pArray[lVar16] = pVVar10->pArray[lVar16] + 1;
        goto LAB_00350893;
      }
    }
    Vec_WrdPush(pVVar9,wVar14);
    Vec_WrdPush(pVVar10,1);
LAB_00350893:
    switch(CVar1 & 0xff) {
    case CBA_BOX_INV:
      iVar4 = 9;
      goto LAB_00350a0d;
    case CBA_BOX_AND:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar4 = 10;
      break;
    default:
      goto switchD_003508b6_caseD_b;
    case CBA_BOX_OR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar4 = 0xc;
      break;
    case CBA_BOX_XOR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 * 3;
      iVar4 = 0xe;
      break;
    case CBA_BOX_MUX:
      iVar4 = Cba_ObjRangeSize(p,uVar17);
      iVar7 = Cba_ObjFinNum(p,uVar17);
      iVar7 = (iVar7 + -2) * iVar4 * 3;
      iVar4 = 0x12;
      break;
    case CBA_BOX_RAND:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 + -1;
      iVar4 = 0x1b;
      break;
    case CBA_BOX_ROR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 + -1;
      iVar4 = 0x1d;
      break;
    case CBA_BOX_RXOR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 3 + -3;
      iVar4 = 0x1f;
      break;
    case CBA_BOX_LNOT:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 + -1;
      iVar4 = 0x21;
      break;
    case CBA_BOX_LAND:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,1);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar7 = iVar4 + iVar7 + -1;
      iVar4 = 0x22;
      break;
    case CBA_BOX_LOR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,1);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar7 = iVar4 + iVar7 + -1;
      iVar4 = 0x24;
      break;
    case CBA_BOX_LXOR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,1);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar7 = iVar4 + iVar7 + 1;
      iVar4 = 0x26;
      break;
    case CBA_BOX_ADD:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 * 9;
      iVar4 = 0x2f;
      break;
    case CBA_BOX_SUB:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 * 9;
      iVar4 = 0x30;
      break;
    case CBA_BOX_MUL:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,1);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar7 = iVar7 * iVar4 * 9;
      iVar4 = 0x31;
      break;
    case CBA_BOX_DIV:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar8 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar8);
      iVar7 = iVar7 * iVar4 * 0xd + iVar8 * -0x13 + 10;
      iVar4 = 0x33;
      break;
    case CBA_BOX_MOD:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar8 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar8);
      iVar7 = iVar7 * iVar4 * 0xd + iVar8 * -7 + -2;
      iVar4 = 0x34;
      break;
    case CBA_BOX_POW:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      dVar19 = pow((double)iVar4,(double)iVar7);
      iVar7 = (int)dVar19 * 10;
      iVar4 = 0x36;
      break;
    case CBA_BOX_MIN:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar7 * 4;
      iVar4 = 0x37;
      break;
    case CBA_BOX_SQRT:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = Cba_ObjFinFon(p,uVar17,0);
      iVar7 = Cba_ObjRangeSize(p,iVar7);
      iVar8 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar8);
      iVar7 = (iVar7 * iVar4 * 0xb) / 8 + (iVar8 * 5) / 2 + -5;
      iVar4 = 0x38;
      break;
    case CBA_BOX_LTHAN:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 6 + -6;
      iVar4 = 0x3b;
      break;
    case CBA_BOX_LETHAN:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 6 + -6;
      iVar4 = 0x3c;
      break;
    case CBA_BOX_METHAN:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 6 + -6;
      iVar4 = 0x3d;
      break;
    case CBA_BOX_MTHAN:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 6 + -6;
      iVar4 = 0x3e;
      break;
    case CBA_BOX_EQU:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 4 + -1;
      iVar4 = 0x3f;
      break;
    case CBA_BOX_NEQU:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      iVar7 = iVar4 * 4 + -1;
      iVar4 = 0x40;
      break;
    case CBA_BOX_SHIL:
      iVar7 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar4);
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Abc_Base2Log(uVar2);
      if (iVar8 < iVar4) {
        iVar4 = iVar8;
      }
      iVar7 = iVar4 * iVar7 * 3;
      iVar4 = 0x41;
      break;
    case CBA_BOX_SHIR:
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar4 = Cba_ObjRangeSize(p,iVar4);
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      iVar7 = Abc_Base2Log(uVar2);
      if (iVar4 < iVar7) {
        iVar7 = iVar4;
      }
      iVar7 = iVar7 * 3;
      iVar4 = 0x42;
      break;
    case CBA_BOX_SHILA:
      iVar7 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar4);
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Abc_Base2Log(uVar2);
      if (iVar8 < iVar4) {
        iVar4 = iVar8;
      }
      iVar7 = iVar4 * iVar7 * 3;
      iVar4 = 0x43;
      break;
    case CBA_BOX_SHIRA:
      iVar7 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar4);
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Abc_Base2Log(uVar2);
      if (iVar8 < iVar4) {
        iVar4 = iVar8;
      }
      iVar7 = iVar4 * iVar7 * 3;
      iVar4 = 0x44;
      break;
    case CBA_BOX_ROTL:
      iVar7 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar4);
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Abc_Base2Log(uVar2);
      if (iVar8 < iVar4) {
        iVar4 = iVar8;
      }
      iVar7 = iVar4 * iVar7 * 3;
      iVar4 = 0x45;
      break;
    case CBA_BOX_ROTR:
      iVar7 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Cba_ObjFinFon(p,uVar17,0);
      iVar8 = Cba_ObjRangeSize(p,iVar4);
      uVar2 = Cba_ObjRangeSize(p,uVar17);
      iVar4 = Abc_Base2Log(uVar2);
      if (iVar8 < iVar4) {
        iVar4 = iVar8;
      }
      iVar7 = iVar4 * iVar7 * 3;
      iVar4 = 0x46;
      break;
    case CBA_BOX_SLICE:
      iVar4 = 0x58;
      goto LAB_00350a0d;
    case CBA_BOX_CONCAT:
      iVar4 = 0x59;
LAB_00350a0d:
      iVar7 = 0;
    }
    Vec_IntAddToEntry(p_00,iVar4,iVar7);
switchD_003508b6_caseD_b:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void Cba_NtkPrintDistrib( Cba_Ntk_t * p, int fVerbose )
{
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( CBA_BOX_LAST );
    int iRnObj = -1, nCountRange = 0;
    int i, k, s, s0, s1;  word Sign;
    Cba_ObjType_t Type;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( CBA_BOX_LAST );
    vOccurs = Vec_PtrStart( CBA_BOX_LAST );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Cba_NtkForEachObj( p, i )
    {
//        char * pName = Cba_ObjName(p, i);
        Type = Cba_ObjType( p, i );
        if ( Cba_ObjSign(p, i) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Cba_ObjRangeSize(p, i), Cba_ObjRangeSize(p, i) & 0xFFFFF );
        if ( Cba_ObjLeft(p, i) && Cba_ObjRight(p, i) )
        {
            if ( iRnObj == -1 )
                iRnObj = 1;
            nCountRange++;
        }
        // 0-input types
        if ( Cba_ObjIsPi(p, i) || (Type == CBA_BOX_BUF && Cba_FonIsConst(Cba_ObjFinFon(p, i, 0))) || Type == CBA_BOX_CONCAT )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), 0, 0 );
        // 1-input types
        else if ( Cba_TypeIsUnary(Type)  )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        // 2-input types (including MUX)
        else if ( Cba_ObjFinNum(p, i) == 1 )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        else
        {
            assert( Cba_ObjFinNum(p, i) >= 2 );
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 1)) );
        }
        // add to storage
        Cba_NtkPrintDistribAddOne( vTypes, vOccurs, Type, Sign );
        // count the number of AIG nodes
        if ( Type == CBA_BOX_MUX )
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUX,      3 * Cba_ObjRangeSize(p, i) * (Cba_ObjFinNum(p, i) - 2) );
        else if ( Type == CBA_BOX_SHIR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIR,  Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIRA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIRA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIL )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHILA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHILA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTR,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTL )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_INV )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_INV, 0 );
        else if ( Type == CBA_BOX_AND )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_AND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_OR )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_OR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_XOR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_XOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SLICE )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_SLICE, 0 );
        else if ( Type == CBA_BOX_CONCAT )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_CONCAT, 0 );
        else if ( Type == CBA_BOX_LNOT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LNOT,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LAND )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LAND,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LOR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_LOR,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LXOR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LXOR,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) + 1 );
        else if ( Type == CBA_BOX_EQU )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_EQU,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_NEQU )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_NEQU,     4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_MTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_LETHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_LETHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_METHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_METHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_RAND )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RAND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_ROR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_RXOR )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RXOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 3 );
        else if ( Type == CBA_BOX_ADD )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_ADD,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SUB )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_SUB,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_MUL )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUL,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) );
        else if ( Type == CBA_BOX_DIV )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_DIV,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 19 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + 10 );
        else if ( Type == CBA_BOX_MOD )  
            Vec_IntAddToEntry( vAnds, CBA_BOX_MOD,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 7 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 2  );
        else if ( Type == CBA_BOX_POW ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_POW,     10 * (int)pow((double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)),(double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0))) );
        else if ( Type == CBA_BOX_MIN )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_MIN,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SQRT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_SQRT,    11 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 8 + 5 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 2 - 5  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", 
            iRnObj, Cba_FonNameStr(p, Cba_ObjFon0(p, iRnObj)), 
            Cba_ObjRangeSize(p, iRnObj), Cba_ObjLeft(p, iRnObj), Cba_ObjRight(p, iRnObj) );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->pDesign->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, pTypeNames[i], p->pDesign->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Cba_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Cba_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}